

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O3

void WOPN_parseInstrument
               (WOPNInstrument *ins,uint8_t *cursor,uint16_t version,uint8_t has_sounding_delays)

{
  ushort uVar1;
  long lVar2;
  ushort uVar3;
  
  strncpy(ins->inst_name,(char *)cursor,0x20);
  lVar2 = 0;
  ins->inst_name[0x1f] = '\0';
  ins->note_offset = *(ushort *)(cursor + 0x20) << 8 | *(ushort *)(cursor + 0x20) >> 8;
  ins->midi_velocity_offset = '\0';
  ins->percussion_key_number = cursor[0x22];
  ins->inst_flags = '\0';
  ins->fbalg = cursor[0x23];
  ins->lfosens = cursor[0x24];
  do {
    (&ins->operators[0].dtfm_30)[lVar2] = cursor[lVar2 + 0x25];
    (&ins->operators[0].level_40)[lVar2] = cursor[lVar2 + 0x26];
    (&ins->operators[0].rsatk_50)[lVar2] = cursor[lVar2 + 0x27];
    (&ins->operators[0].amdecay1_60)[lVar2] = cursor[lVar2 + 0x28];
    (&ins->operators[0].decay2_70)[lVar2] = cursor[lVar2 + 0x29];
    (&ins->operators[0].susrel_80)[lVar2] = cursor[lVar2 + 0x2a];
    (&ins->operators[0].ssgeg_90)[lVar2] = cursor[lVar2 + 0x2b];
    lVar2 = lVar2 + 7;
  } while (lVar2 != 0x1c);
  if (has_sounding_delays != '\0' && 1 < version) {
    uVar1 = *(ushort *)(cursor + 0x41) << 8 | *(ushort *)(cursor + 0x41) >> 8;
    ins->delay_on_ms = uVar1;
    uVar3 = *(ushort *)(cursor + 0x43) << 8 | *(ushort *)(cursor + 0x43) >> 8;
    ins->delay_off_ms = uVar3;
    if ((version < 3) && (uVar1 == 0 && uVar3 == 0)) {
      ins->inst_flags = '\x02';
    }
  }
  return;
}

Assistant:

static void WOPN_parseInstrument(WOPNInstrument *ins, uint8_t *cursor, uint16_t version, uint8_t has_sounding_delays)
{
    int l;
    strncpy(ins->inst_name, (const char*)cursor, 32);
    ins->inst_name[31] = '\0';
    ins->note_offset = toSint16BE(cursor + 32);
    ins->midi_velocity_offset = 0;  /* TODO: for future version > 2 */
    ins->percussion_key_number = cursor[34];
    ins->inst_flags = 0;  /* TODO: for future version > 2 */
    ins->fbalg = cursor[35];
    ins->lfosens = cursor[36];
    for(l = 0; l < 4; l++)
    {
        size_t off = 37 + (size_t)(l) * 7;
        ins->operators[l].dtfm_30     = cursor[off + 0];
        ins->operators[l].level_40    = cursor[off + 1];
        ins->operators[l].rsatk_50    = cursor[off + 2];
        ins->operators[l].amdecay1_60 = cursor[off + 3];
        ins->operators[l].decay2_70   = cursor[off + 4];
        ins->operators[l].susrel_80   = cursor[off + 5];
        ins->operators[l].ssgeg_90    = cursor[off + 6];
    }
    if((version >= 2) && has_sounding_delays)
    {
        ins->delay_on_ms  = toUint16BE(cursor + 65);
        ins->delay_off_ms = toUint16BE(cursor + 67);

        /* Null delays indicate the blank instrument in version 2 */
        if((version < 3) && ins->delay_on_ms == 0 && ins->delay_off_ms == 0)
            ins->inst_flags |= WOPN_Ins_IsBlank;
    }
}